

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

uint32_t btorsim_bv_get_num_leading_zeros(BtorSimBitVector *bv)

{
  uint32_t uVar1;
  BtorSimBitVector *in_RDI;
  uint32_t res;
  uint32_t i;
  uint32_t local_10;
  uint32_t local_c;
  
  local_c = in_RDI->width;
  local_10 = 0;
  while ((local_c = local_c - 1, local_c != 0xffffffff &&
         (uVar1 = btorsim_bv_get_bit(in_RDI,local_c), uVar1 == 0))) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

uint32_t
btorsim_bv_get_num_leading_zeros (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i, res;

  for (i = bv->width - 1, res = 0; i < UINT_MAX; i--)
  {
    if (btorsim_bv_get_bit (bv, i)) break;
    res += 1;
  }

  return res;
}